

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O3

bool __thiscall
iDynTree::SensorsList::removeSensor
          (SensorsList *this,SensorType *sensor_type,ptrdiff_t sensor_index)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pvVar3;
  long lVar4;
  SensorsListPimpl *pSVar5;
  pointer ppSVar6;
  long lVar7;
  pointer __src;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
  *this_00;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_70;
  long *local_48;
  long local_40;
  ptrdiff_t local_38;
  
  pSVar5 = this->pimpl;
  uVar8 = (ulong)*sensor_type;
  pvVar3 = (pSVar5->allSensors).
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&pvVar3[uVar8].
                    super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                    _M_impl;
  ppSVar6 = pvVar3[uVar8].
            super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar7 = (long)ppSVar6 - lVar4 >> 3;
  if (sensor_index < lVar7) {
    pvVar3 = pvVar3 + uVar8;
    puVar1 = (undefined8 *)(lVar4 + sensor_index * 8);
    __src = (pointer)(puVar1 + 1);
    local_48 = (long *)*puVar1;
    local_40 = lVar7;
    local_38 = sensor_index;
    if (__src != ppSVar6) {
      memmove((void *)(lVar4 + sensor_index * 8),__src,(long)ppSVar6 - (long)__src);
      ppSVar6 = (pvVar3->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pSVar5 = this->pimpl;
      uVar8 = (ulong)*sensor_type;
    }
    (pvVar3->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppSVar6 + -1;
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
               *)((pSVar5->sensorsNameToIndex).
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             *)this_00);
    ppSVar6 = *(pointer *)
               &(pvVar3->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                )._M_impl;
    if ((pvVar3->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppSVar6) {
      paVar2 = &local_70.first.field_2;
      uVar8 = 0;
      do {
        (*ppSVar6[uVar8]->_vptr_Sensor[2])(&local_90);
        if (local_90 == &local_80) {
          local_70.first.field_2._8_8_ = local_80._8_8_;
          local_70.first._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_70.first._M_dataplus._M_p = (pointer)local_90;
        }
        local_70.first.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
        local_70.first.field_2._M_local_buf[0] = local_80._M_local_buf[0];
        local_70.first._M_string_length = local_88;
        local_88 = 0;
        local_80._M_local_buf[0] = '\0';
        local_90 = &local_80;
        local_70.second = uVar8;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,long>>(this_00,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_70.first._M_dataplus._M_p,
                          local_70.first.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                            local_80._M_local_buf[0]) + 1);
        }
        uVar8 = uVar8 + 1;
        ppSVar6 = *(pointer *)
                   &(pvVar3->
                    super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
                    _M_impl;
      } while (uVar8 < (ulong)((long)(pvVar3->
                                     super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >>
                              3));
    }
    sensor_index = local_38;
    lVar7 = local_40;
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
  }
  return sensor_index < lVar7;
}

Assistant:

bool SensorsList::removeSensor(const SensorType & sensor_type, const std::ptrdiff_t sensor_index)
    {
        std::vector<Sensor*>& typeVector = this->pimpl->allSensors[sensor_type];
        if (sensor_index >= static_cast<std::ptrdiff_t>(typeVector.size())) {
            return false;
        }
        Sensor *s = typeVector[sensor_index];
        typeVector.erase(typeVector.begin() + sensor_index);
        SensorsListPimpl::SensorNameToIndexMap& nameToIndex = this->pimpl->sensorsNameToIndex[sensor_type];
        // We have to rebuild the name->index map as indices have changed
        nameToIndex.clear();
        for (size_t index = 0; index < typeVector.size(); ++index) {
            nameToIndex.insert(SensorsListPimpl::SensorNameToIndexMap::value_type(typeVector[index]->getName(), index));
        }

        delete s;
        return true;
    }